

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_4::Validator::CheckModule(Validator *this)

{
  SharedValidator *pSVar1;
  anon_union_16_2_ecfd7102_for_Location_1 *rhs;
  ModuleFieldType *loc;
  int iVar2;
  ExternalKind kind;
  Module *this_00;
  _func_int **pp_Var3;
  Type *pTVar4;
  _func_int *p_Var5;
  Type *result_types;
  Type elem_type;
  ModuleField *pMVar6;
  ModuleField *pMVar7;
  pointer ppMVar8;
  Index IVar9;
  Result RVar10;
  ArrayType *array_type;
  Location *pLVar11;
  Type type;
  pair<wabt::Type,_unsigned_int> *decl;
  ModuleField *pMVar12;
  Location *loc_00;
  Var *this_01;
  ModuleField *field_3;
  ModuleField *pMVar13;
  ModuleField *field_11;
  ModuleField *field;
  Field *field_1;
  _func_int *p_Var14;
  string_view name;
  TypeMutVector type_muts;
  TypeMut local_338;
  ExprVisitor local_328;
  Var local_2b8;
  Var local_270;
  Var local_228;
  Var local_1e0;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  this_00 = this->current_module_;
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    pSVar1 = &this->validator_;
    do {
      if (pMVar13->type_ == Type) {
        pp_Var3 = pMVar13[1]._vptr_ModuleField;
        iVar2 = *(int *)(pp_Var3 + 9);
        if (iVar2 == 2) {
          RVar10 = SharedValidator::OnArrayType(pSVar1,&pMVar13->loc,*(TypeMut *)(pp_Var3 + 0xe));
LAB_0013f9c9:
          (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
        }
        else if (iVar2 == 1) {
          local_328.delegate_ = (Delegate *)0x0;
          local_328.state_stack_.
          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_328.state_stack_.
          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          p_Var5 = pp_Var3[0xb];
          for (p_Var14 = pp_Var3[10]; p_Var14 != p_Var5; p_Var14 = p_Var14 + 0x30) {
            local_338.type = *(Type *)(p_Var14 + 0x20);
            local_338.mutable_ = (bool)p_Var14[0x28];
            if (local_328.state_stack_.
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_328.state_stack_.
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::
              _M_realloc_insert<wabt::TypeMut>
                        ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&local_328,
                         (iterator)
                         local_328.state_stack_.
                         super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                         ._M_impl.super__Vector_impl_data._M_start,&local_338);
            }
            else {
              ((TypeMut *)
              local_328.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start)->mutable_ = (bool)p_Var14[0x28];
              *(undefined3 *)
               &((TypeMut *)
                local_328.state_stack_.
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_0x9 = local_338._9_3_;
              ((TypeMut *)
              local_328.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start)->type = local_338.type;
              local_328.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)local_328.state_stack_.
                                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0xc);
            }
          }
          RVar10 = SharedValidator::OnStructType
                             (pSVar1,&pMVar13->loc,
                              (int)((ulong)((long)local_328.state_stack_.
                                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                           (long)local_328.delegate_) >> 2) * -0x55555555,
                              (TypeMut *)local_328.delegate_);
          (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
          if ((TypeMut *)local_328.delegate_ != (TypeMut *)0x0) {
            operator_delete(local_328.delegate_,
                            (long)local_328.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_328.delegate_);
          }
        }
        else if (iVar2 == 0) {
          pTVar4 = (Type *)pp_Var3[10];
          p_Var14 = pp_Var3[0xb];
          p_Var5 = pp_Var3[0xe];
          result_types = (Type *)pp_Var3[0xd];
          IVar9 = Module::GetFuncTypeIndex(this_00,(FuncSignature *)(pp_Var3 + 10));
          RVar10 = SharedValidator::OnFuncType
                             (pSVar1,&pMVar13->loc,
                              (Index)((ulong)((long)p_Var14 - (long)pTVar4) >> 3),pTVar4,
                              (Index)((ulong)((long)p_Var5 - (long)result_types) >> 3),result_types,
                              IVar9);
          goto LAB_0013f9c9;
        }
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
    pMVar13 = (this_00->fields).first_;
    if (pMVar13 != (ModuleField *)0x0) {
      do {
        if (pMVar13->type_ != Import) goto switchD_0013fa91_default;
        pp_Var3 = pMVar13[1]._vptr_ModuleField;
        switch(*(undefined4 *)(pp_Var3 + 9)) {
        case 0:
          GetFuncTypeIndex(&local_78,(Validator *)this->current_module_,&pMVar13->loc,
                           (FuncDeclaration *)(pp_Var3 + 0xe));
          RVar10 = SharedValidator::OnFunction(pSVar1,&pMVar13->loc,&local_78);
          (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
          this_01 = &local_78;
          goto LAB_0013fb25;
        case 1:
          RVar10 = SharedValidator::OnTable
                             (pSVar1,&pMVar13->loc,*(Type *)(pp_Var3 + 0x11),
                              (Limits *)(pp_Var3 + 0xe));
          break;
        case 2:
          RVar10 = SharedValidator::OnMemory(pSVar1,&pMVar13->loc,(Limits *)(pp_Var3 + 0xe));
          break;
        case 3:
          RVar10 = SharedValidator::OnGlobalImport
                             (pSVar1,&pMVar13->loc,*(Type *)(pp_Var3 + 0xe),*(bool *)(pp_Var3 + 0xf)
                             );
          break;
        case 4:
          GetFuncTypeIndex(&local_c0,(Validator *)this->current_module_,&pMVar13->loc,
                           (FuncDeclaration *)(pp_Var3 + 0xe));
          RVar10 = SharedValidator::OnTag(pSVar1,&pMVar13->loc,&local_c0);
          (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
          this_01 = &local_c0;
LAB_0013fb25:
          Var::~Var(this_01);
        default:
          goto switchD_0013fa91_default;
        }
        (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
switchD_0013fa91_default:
        pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
      } while (pMVar13 != (ModuleField *)0x0);
      pMVar13 = (this_00->fields).first_;
      if (pMVar13 != (ModuleField *)0x0) {
        do {
          if (pMVar13->type_ == Func) {
            GetFuncTypeIndex(&local_108,(Validator *)this->current_module_,&pMVar13->loc,
                             (FuncDeclaration *)&pMVar13[1].loc.filename._M_str);
            RVar10 = SharedValidator::OnFunction(pSVar1,&pMVar13->loc,&local_108);
            (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
            Var::~Var(&local_108);
          }
          pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
        } while (pMVar13 != (ModuleField *)0x0);
        pMVar13 = (this_00->fields).first_;
        if (pMVar13 != (ModuleField *)0x0) {
          do {
            if (pMVar13->type_ == Table) {
              elem_type.enum_ = pMVar13[1].type_;
              elem_type.type_index_ = *(Index *)&pMVar13[1].field_0x3c;
              RVar10 = SharedValidator::OnTable
                                 (pSVar1,&pMVar13->loc,elem_type,
                                  (Limits *)&pMVar13[1].loc.filename._M_str);
              (this->result_).enum_ =
                   (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
            }
            pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
          } while (pMVar13 != (ModuleField *)0x0);
          pMVar13 = (this_00->fields).first_;
          if (pMVar13 != (ModuleField *)0x0) {
            do {
              if (pMVar13->type_ == Memory) {
                RVar10 = SharedValidator::OnMemory
                                   (pSVar1,&pMVar13->loc,(Limits *)&pMVar13[1].loc.filename._M_str);
                (this->result_).enum_ =
                     (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
              }
              pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
            } while (pMVar13 != (ModuleField *)0x0);
            pMVar13 = (this_00->fields).first_;
            if (pMVar13 != (ModuleField *)0x0) {
              do {
                if (pMVar13->type_ == Global) {
                  RVar10 = SharedValidator::OnGlobal
                                     (pSVar1,&pMVar13->loc,(Type)pMVar13[1].loc.filename._M_str,
                                      (bool)pMVar13[1].loc.field_1.field2[0]);
                  (this->result_).enum_ =
                       (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                  RVar10 = SharedValidator::BeginInitExpr
                                     (pSVar1,&pMVar13->loc,(Type)pMVar13[1].loc.filename._M_str);
                  (this->result_).enum_ =
                       (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                  ExprVisitor::ExprVisitor(&local_328,&this->super_Delegate);
                  RVar10 = ExprVisitor::VisitExprList
                                     (&local_328,(ExprList *)((long)&pMVar13[1].loc.field_1 + 8));
                  (this->result_).enum_ =
                       (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                  RVar10 = SharedValidator::EndInitExpr(pSVar1);
                  (this->result_).enum_ =
                       (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                  if (local_328.catch_index_stack_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_328.catch_index_stack_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_328.catch_index_stack_.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_328.catch_index_stack_.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_328.expr_iter_stack_.
                      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_328.expr_iter_stack_.
                                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_328.expr_iter_stack_.
                                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_328.expr_iter_stack_.
                                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_328.expr_stack_.
                      super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_328.expr_stack_.
                                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_328.expr_stack_.
                                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_328.expr_stack_.
                                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((TypeMut *)
                      local_328.state_stack_.
                      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                      ._M_impl.super__Vector_impl_data._M_start != (TypeMut *)0x0) {
                    operator_delete(local_328.state_stack_.
                                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_328.state_stack_.
                                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_328.state_stack_.
                                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
              } while (pMVar13 != (ModuleField *)0x0);
              pMVar13 = (this_00->fields).first_;
              if (pMVar13 != (ModuleField *)0x0) {
                do {
                  if (pMVar13->type_ == Tag) {
                    GetFuncTypeIndex(&local_150,(Validator *)this->current_module_,&pMVar13->loc,
                                     (FuncDeclaration *)&pMVar13[1].loc.filename._M_str);
                    RVar10 = SharedValidator::OnTag(pSVar1,&pMVar13->loc,&local_150);
                    (this->result_).enum_ =
                         (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                    Var::~Var(&local_150);
                  }
                  pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
                } while (pMVar13 != (ModuleField *)0x0);
                pMVar13 = (this_00->fields).first_;
                if (pMVar13 != (ModuleField *)0x0) {
                  do {
                    if (pMVar13->type_ == Export) {
                      kind = *(ExternalKind *)&pMVar13[1].loc.filename._M_str;
                      Var::Var(&local_198,(Var *)&pMVar13[1].loc.field_1.field_0);
                      name._M_str = (char *)pMVar13[1]._vptr_ModuleField;
                      name._M_len = (size_t)pMVar13[1].super_intrusive_list_base<wabt::ModuleField>.
                                            next_;
                      RVar10 = SharedValidator::OnExport(pSVar1,&pMVar13->loc,kind,&local_198,name);
                      (this->result_).enum_ =
                           (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                      Var::~Var(&local_198);
                    }
                    pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
                  } while (pMVar13 != (ModuleField *)0x0);
                  pMVar13 = (this_00->fields).first_;
                  if (pMVar13 != (ModuleField *)0x0) {
                    do {
                      if (pMVar13->type_ == Start) {
                        Var::Var(&local_1e0,(Var *)(pMVar13 + 1));
                        RVar10 = SharedValidator::OnStart(pSVar1,&pMVar13->loc,&local_1e0);
                        (this->result_).enum_ =
                             (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                        Var::~Var(&local_1e0);
                      }
                      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
                    } while (pMVar13 != (ModuleField *)0x0);
                    for (pMVar13 = (this_00->fields).first_; pMVar13 != (ModuleField *)0x0;
                        pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_) {
                      if (pMVar13->type_ == ElemSegment) {
                        pLVar11 = &pMVar13->loc;
                        Var::Var(&local_228,(Var *)&pMVar13[1].loc.field_1.field_0);
                        RVar10 = SharedValidator::OnElemSegment
                                           (pSVar1,pLVar11,&local_228,
                                            *(SegmentKind *)&pMVar13[1]._vptr_ModuleField);
                        (this->result_).enum_ =
                             (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                        Var::~Var(&local_228);
                        RVar10 = SharedValidator::OnElemSegmentElemType
                                           (pSVar1,pLVar11,
                                            *(Type *)((long)&pMVar13[2].loc.field_1 + 8));
                        (this->result_).enum_ =
                             (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                        if (pMVar13[3].super_intrusive_list_base<wabt::ModuleField>.next_ !=
                            (ModuleField *)0x0) {
                          RVar10 = SharedValidator::BeginInitExpr
                                             (pSVar1,pLVar11,(Type)0xffffffffffffffff);
                          (this->result_).enum_ =
                               (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                          ExprVisitor::ExprVisitor(&local_328,&this->super_Delegate);
                          RVar10 = ExprVisitor::VisitExprList
                                             (&local_328,(ExprList *)&pMVar13[2].type_);
                          (this->result_).enum_ =
                               (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                          RVar10 = SharedValidator::EndInitExpr(pSVar1);
                          (this->result_).enum_ =
                               (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                          if (local_328.catch_index_stack_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_328.catch_index_stack_.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_328.catch_index_stack_.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_328.catch_index_stack_.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (local_328.expr_iter_stack_.
                              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_328.expr_iter_stack_.
                                            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_328.expr_iter_stack_.
                                                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_328.expr_iter_stack_.
                                                                                                        
                                                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (local_328.expr_stack_.
                              super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_328.expr_stack_.
                                            super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_328.expr_stack_.
                                                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_328.expr_stack_.
                                                                                                        
                                                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((TypeMut *)
                              local_328.state_stack_.
                              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                              ._M_impl.super__Vector_impl_data._M_start != (TypeMut *)0x0) {
                            operator_delete(local_328.state_stack_.
                                            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_328.state_stack_.
                                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_328.state_stack_.
                                                                                                        
                                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                        }
                        pMVar6 = (ModuleField *)pMVar13[3].loc.filename._M_len;
                        for (pMVar12 = pMVar13[3].super_intrusive_list_base<wabt::ModuleField>.prev_
                            ; pMVar12 != pMVar6; pMVar12 = (ModuleField *)&pMVar12->loc) {
                          pMVar7 = (pMVar12->super_intrusive_list_base<wabt::ModuleField>).prev_;
                          if (pMVar7 != (ModuleField *)0x0) {
                            loc_00 = pLVar11;
                            if (pMVar7 == (ModuleField *)0x1) {
                              pp_Var3 = pMVar12->_vptr_ModuleField;
                              loc_00 = (Location *)(pp_Var3 + 3);
                              if (*(int *)(pp_Var3 + 7) == 0x24) {
                                Var::Var(&local_270,(Var *)(pp_Var3 + 8));
                                RVar10 = SharedValidator::OnElemSegmentElemExpr_RefFunc
                                                   (pSVar1,loc_00,&local_270);
                                (this->result_).enum_ =
                                     (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error)
                                ;
                                Var::~Var(&local_270);
                                goto LAB_001401eb;
                              }
                              if (*(int *)(pp_Var3 + 7) != 0x25) goto LAB_001401cb;
                              RVar10 = SharedValidator::OnElemSegmentElemExpr_RefNull
                                                 (pSVar1,loc_00,*(Type *)((long)pp_Var3 + 0x3c));
                            }
                            else {
LAB_001401cb:
                              RVar10 = SharedValidator::OnElemSegmentElemExpr_Other(pSVar1,loc_00);
                            }
                            (this->result_).enum_ =
                                 (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
                          }
LAB_001401eb:
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pSVar1 = &this->validator_;
  SharedValidator::OnDataCount
            (pSVar1,(Index)((ulong)((long)(this_00->data_segments).
                                          super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_00->data_segments).
                                         super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    IVar9 = this_00->num_func_imports;
    do {
      if (pMVar13->type_ == Func) {
        loc = &pMVar13[6].type_;
        pLVar11 = (Location *)loc;
        if (*(long *)((long)&pMVar13[6].loc.field_1 + 8) != 0) {
          pLVar11 = (Location *)(pMVar13[6].loc.field_1.field_1.offset + 0x18);
        }
        RVar10 = SharedValidator::BeginFunctionBody(pSVar1,(Location *)loc,IVar9);
        (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
        pMVar6 = (ModuleField *)pMVar13[5].loc.filename._M_len;
        for (pMVar12 = pMVar13[5].super_intrusive_list_base<wabt::ModuleField>.prev_;
            pMVar12 != pMVar6;
            pMVar12 = (ModuleField *)
                      ((long)&(pMVar12->super_intrusive_list_base<wabt::ModuleField>).next_ + 4)) {
          RVar10 = SharedValidator::OnLocalDecl
                             (pSVar1,(Location *)loc,
                              *(Index *)&(pMVar12->super_intrusive_list_base<wabt::ModuleField>).
                                         next_,(Type)pMVar12->_vptr_ModuleField);
          (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
        }
        ExprVisitor::ExprVisitor(&local_328,&this->super_Delegate);
        RVar10 = ExprVisitor::VisitExprList(&local_328,(ExprList *)&pMVar13[6].loc.filename._M_str);
        (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
        RVar10 = SharedValidator::EndFunctionBody(pSVar1,pLVar11);
        (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
        if (local_328.catch_index_stack_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_328.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_328.catch_index_stack_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_328.catch_index_stack_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_328.expr_iter_stack_.
            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_328.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_328.expr_iter_stack_.
                                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_328.expr_iter_stack_.
                                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_328.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_328.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_328.expr_stack_.
                                super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_328.expr_stack_.
                                super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((TypeMut *)
            local_328.state_stack_.
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_start != (TypeMut *)0x0) {
          operator_delete(local_328.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_328.state_stack_.
                                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_328.state_stack_.
                                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        IVar9 = IVar9 + 1;
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
    for (pMVar13 = (this_00->fields).first_; pMVar13 != (ModuleField *)0x0;
        pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_) {
      if (pMVar13->type_ == DataSegment) {
        rhs = &pMVar13[1].loc.field_1;
        Var::Var(&local_2b8,(Var *)&rhs->field_0);
        RVar10 = SharedValidator::OnDataSegment
                           (pSVar1,&pMVar13->loc,&local_2b8,
                            *(SegmentKind *)&pMVar13[1]._vptr_ModuleField);
        (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_2b8);
        if (pMVar13[3]._vptr_ModuleField != (_func_int **)0x0) {
          IVar9 = Module::GetMemoryIndex(this_00,(Var *)&rhs->field_0);
          ppMVar8 = (this_00->memories).
                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          type.enum_ = I32;
          type.type_index_ = 0xffffffff;
          if ((ulong)IVar9 <
              (ulong)((long)(this_00->memories).
                            super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar8 >> 3)) {
            type = (Type)~(ulong)(ppMVar8[IVar9]->page_limits).is_64;
          }
          RVar10 = SharedValidator::BeginInitExpr(pSVar1,&pMVar13->loc,type);
          (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
          ExprVisitor::ExprVisitor(&local_328,&this->super_Delegate);
          RVar10 = ExprVisitor::VisitExprList
                             (&local_328,(ExprList *)((long)&pMVar13[2].loc.field_1 + 8));
          (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
          RVar10 = SharedValidator::EndInitExpr(pSVar1);
          (this->result_).enum_ = (uint)(RVar10.enum_ == Error || (this->result_).enum_ == Error);
          if (local_328.catch_index_stack_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_328.catch_index_stack_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_328.catch_index_stack_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_328.catch_index_stack_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_328.expr_iter_stack_.
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_328.expr_iter_stack_.
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_328.expr_iter_stack_.
                                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_328.expr_iter_stack_.
                                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_328.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_328.expr_stack_.
                            super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_328.expr_stack_.
                                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_328.expr_stack_.
                                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((TypeMut *)
              local_328.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start != (TypeMut *)0x0) {
            operator_delete(local_328.state_stack_.
                            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_328.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_328.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
    }
  }
  RVar10 = SharedValidator::EndModule(pSVar1);
  RVar10.enum_._0_1_ = RVar10.enum_ == Error || (this->result_).enum_ == Error;
  RVar10.enum_._1_3_ = 0;
  (this->result_).enum_ = RVar10.enum_;
  return (Result)RVar10.enum_;
}

Assistant:

Result Validator::CheckModule() {
  const Module* module = current_module_;

  // Type section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TypeModuleField>(&field)) {
      switch (f->type->kind()) {
        case TypeEntryKind::Func: {
          FuncType* func_type = cast<FuncType>(f->type.get());
          result_ |= validator_.OnFuncType(
              field.loc, func_type->sig.param_types.size(),
              func_type->sig.param_types.data(),
              func_type->sig.result_types.size(),
              func_type->sig.result_types.data(),
              module->GetFuncTypeIndex(func_type->sig));
          break;
        }

        case TypeEntryKind::Struct: {
          StructType* struct_type = cast<StructType>(f->type.get());
          TypeMutVector type_muts;
          for (auto&& field : struct_type->fields) {
            type_muts.push_back(TypeMut{field.type, field.mutable_});
          }
          result_ |= validator_.OnStructType(field.loc, type_muts.size(),
                                             type_muts.data());
          break;
        }

        case TypeEntryKind::Array: {
          ArrayType* array_type = cast<ArrayType>(f->type.get());
          result_ |= validator_.OnArrayType(
              field.loc,
              TypeMut{array_type->field.type, array_type->field.mutable_});
          break;
        }
      }
    }
  }

  // Import section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ImportModuleField>(&field)) {
      switch (f->import->kind()) {
        case ExternalKind::Func: {
          auto&& func = cast<FuncImport>(f->import.get())->func;
          result_ |= validator_.OnFunction(
              field.loc, GetFuncTypeIndex(field.loc, func.decl));
          break;
        }

        case ExternalKind::Table: {
          auto&& table = cast<TableImport>(f->import.get())->table;
          result_ |=
              validator_.OnTable(field.loc, table.elem_type, table.elem_limits);
          break;
        }

        case ExternalKind::Memory: {
          auto&& memory = cast<MemoryImport>(f->import.get())->memory;
          result_ |= validator_.OnMemory(field.loc, memory.page_limits);
          break;
        }

        case ExternalKind::Global: {
          auto&& global = cast<GlobalImport>(f->import.get())->global;
          result_ |= validator_.OnGlobalImport(field.loc, global.type,
                                               global.mutable_);
          break;
        }

        case ExternalKind::Tag: {
          auto&& tag = cast<TagImport>(f->import.get())->tag;
          result_ |= validator_.OnTag(field.loc,
                                      GetFuncTypeIndex(field.loc, tag.decl));
          break;
        }
      }
    }
  }

  // Func section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      result_ |= validator_.OnFunction(
          field.loc, GetFuncTypeIndex(field.loc, f->func.decl));
    }
  }

  // Table section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TableModuleField>(&field)) {
      result_ |= validator_.OnTable(field.loc, f->table.elem_type,
                                    f->table.elem_limits);
    }
  }

  // Memory section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<MemoryModuleField>(&field)) {
      result_ |= validator_.OnMemory(field.loc, f->memory.page_limits);
    }
  }

  // Global section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<GlobalModuleField>(&field)) {
      result_ |=
          validator_.OnGlobal(field.loc, f->global.type, f->global.mutable_);

      // Init expr.
      result_ |= validator_.BeginInitExpr(field.loc, f->global.type);
      ExprVisitor visitor(this);
      result_ |=
          visitor.VisitExprList(const_cast<ExprList&>(f->global.init_expr));
      result_ |= validator_.EndInitExpr();
    }
  }

  // Tag section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TagModuleField>(&field)) {
      result_ |=
          validator_.OnTag(field.loc, GetFuncTypeIndex(field.loc, f->tag.decl));
    }
  }

  // Export section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ExportModuleField>(&field)) {
      result_ |= validator_.OnExport(field.loc, f->export_.kind, f->export_.var,
                                     f->export_.name);
    }
  }

  // Start section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<StartModuleField>(&field)) {
      result_ |= validator_.OnStart(field.loc, f->start);
    }
  }

  // Elem segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ElemSegmentModuleField>(&field)) {
      result_ |= validator_.OnElemSegment(field.loc, f->elem_segment.table_var,
                                          f->elem_segment.kind);

      result_ |= validator_.OnElemSegmentElemType(field.loc,
                                                  f->elem_segment.elem_type);

      // Init expr.
      if (f->elem_segment.offset.size()) {
        result_ |= validator_.BeginInitExpr(field.loc, Type::I32);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(
            const_cast<ExprList&>(f->elem_segment.offset));
        result_ |= validator_.EndInitExpr();
      }

      // Element expr.
      for (auto&& elem_expr : f->elem_segment.elem_exprs) {
        if (elem_expr.size() == 1) {
          const Expr* expr = &elem_expr.front();
          switch (expr->type()) {
            case ExprType::RefNull:
              result_ |= validator_.OnElemSegmentElemExpr_RefNull(
                  expr->loc, cast<RefNullExpr>(expr)->type);
              break;
            case ExprType::RefFunc:
              result_ |= validator_.OnElemSegmentElemExpr_RefFunc(
                  expr->loc, cast<RefFuncExpr>(expr)->var);
              break;
            default:
              result_ |= validator_.OnElemSegmentElemExpr_Other(expr->loc);
              break;
          }
        } else if (elem_expr.size() > 1) {
          result_ |= validator_.OnElemSegmentElemExpr_Other(field.loc);
        }
      }
    }
  }

  // DataCount section.
  validator_.OnDataCount(module->data_segments.size());

  // Code section.
  Index func_index = module->num_func_imports;
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      const Location& body_start = f->func.loc;
      const Location& body_end =
          f->func.exprs.empty() ? body_start : f->func.exprs.back().loc;
      result_ |= validator_.BeginFunctionBody(body_start, func_index++);

      for (auto&& decl : f->func.local_types.decls()) {
        result_ |= validator_.OnLocalDecl(body_start, decl.second, decl.first);
      }

      ExprVisitor visitor(this);
      result_ |= visitor.VisitExprList(const_cast<ExprList&>(f->func.exprs));
      result_ |= validator_.EndFunctionBody(body_end);
    }
  }

  // Data segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<DataSegmentModuleField>(&field)) {
      result_ |= validator_.OnDataSegment(field.loc, f->data_segment.memory_var,
                                          f->data_segment.kind);

      // Init expr.
      if (f->data_segment.offset.size()) {
        Type offset_type = Type::I32;
        Index memory_index = module->GetMemoryIndex(f->data_segment.memory_var);
        if (memory_index < module->memories.size() &&
            module->memories[memory_index]->page_limits.is_64) {
          offset_type = Type::I64;
        }
        result_ |= validator_.BeginInitExpr(field.loc, offset_type);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(
            const_cast<ExprList&>(f->data_segment.offset));
        result_ |= validator_.EndInitExpr();
      }
    }
  }

  result_ |= validator_.EndModule();

  return result_;
}